

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rand.cpp
# Opt level: O2

void __thiscall
ON_RandomNumberGenerator::TwoGaussians(ON_RandomNumberGenerator *this,double *u,double *v)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  if (v != (double *)0x0 && u != (double *)0x0) {
    dVar1 = RandomDouble(this);
    dVar2 = RandomDouble(this);
    dVar1 = log((double)(-(ulong)(dVar1 < 1e-20) & 0x3fe0000000000000 |
                        ~-(ulong)(dVar1 < 1e-20) &
                        (~-(ulong)(1.0 < dVar1) & (ulong)dVar1 |
                        -(ulong)(1.0 < dVar1) & 0x3fe0000000000000)));
    dVar1 = dVar1 * -2.0;
    if (dVar1 < 0.0) {
      dVar1 = sqrt(dVar1);
    }
    else {
      dVar1 = SQRT(dVar1);
    }
    dVar3 = cos(dVar2 * 6.283185307179586);
    *u = dVar3 * dVar1;
    dVar2 = sin(dVar2 * 6.283185307179586);
    *v = dVar2 * dVar1;
  }
  return;
}

Assistant:

void ON_RandomNumberGenerator::TwoGaussians(double* u, double* v)
{
  if (!u || !v) return;
  double t = RandomDouble();
  double s = RandomDouble();
  // if there is a problem with the random number generator, we don't want to crash the FPU in the logarithm
  if (t < 1e-20 || t > 1.0)  
    t = .5;
  double m = sqrt(-2.0 * log(t));
  *u = m * cos(ON_2PI * s);
  *v = m * sin(ON_2PI * s);
}